

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O2

void __thiscall MppDevServer::~MppDevServer(MppDevServer *this)

{
  MppClientType client_type;
  
  for (client_type = VPU_CLIENT_VDPU1; client_type != VPU_CLIENT_BUTT;
      client_type = client_type + VPU_CLIENT_VDPU2) {
    bat_server_put(this,client_type);
  }
  clear(this);
  pthread_mutex_destroy((pthread_mutex_t *)this);
  return;
}

Assistant:

MppDevServer::~MppDevServer()
{
    RK_S32 i;

    for (i = 0; i < VPU_CLIENT_BUTT; i++)
        bat_server_put((MppClientType)i);

    clear();
}